

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char buffer [6];
  char acStack_2e [4];
  byte abStack_2a [2];
  
  if (length == 0) {
    __assert_fail("length != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x50,
                  "void FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation(const char *, int, int, StringBuilder *) const"
                 );
  }
  StringBuilder::AddCharacter(result_builder,*decimal_digits);
  if (length != 1) {
    StringBuilder::AddCharacter(result_builder,'.');
    StringBuilder::AddSubstring(result_builder,decimal_digits + 1,length + -1);
  }
  StringBuilder::AddCharacter(result_builder,this->exponent_character_);
  if (exponent < 0) {
    StringBuilder::AddCharacter(result_builder,'-');
    exponent = -exponent;
  }
  else if ((this->flags_ & 1) != 0) {
    StringBuilder::AddCharacter(result_builder,'+');
  }
  if (exponent != 0) {
    if ((uint)exponent < 10000) {
      abStack_2a[1] = 0;
      lVar2 = 0x500000000;
      lVar3 = 0;
      do {
        lVar2 = lVar2 + -0x100000000;
        abStack_2a[lVar3] = (char)exponent + (char)((uint)exponent / 10) * -10 | 0x30;
        lVar3 = lVar3 + -1;
        bVar1 = 9 < (uint)exponent;
        exponent = (uint)exponent / 10;
      } while (bVar1);
      StringBuilder::AddSubstring(result_builder,acStack_2e + (lVar2 >> 0x20),-(int)lVar3);
      return;
    }
    __assert_fail("exponent < 1e4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,99,
                  "void FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation(const char *, int, int, StringBuilder *) const"
                 );
  }
  StringBuilder::AddCharacter(result_builder,'0');
  return;
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  ASSERT(exponent < 1e4);
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}